

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall MeterPrivate::drawNeedle(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  int w;
  int x;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  QColor QStack_b8;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  QRadialGradient gradient;
  
  uVar1 = this->radius;
  QPainter::save();
  QPainter::translate(painter,(double)this->radius,(double)this->radius);
  QPainter::rotate((params->scaleDegree * this->value) / (this->maxValue - this->minValue) +
                   params->startScaleAngle);
  QBrush::QBrush((QBrush *)&QStack_b8,&this->needleColor,1);
  QPen::QPen(SUB84((double)this->radius / 75.0,0),&gradient,&QStack_b8,1,0x10,0x40);
  QPainter::setPen((QPen *)painter);
  local_98._8_4_ = extraout_XMM0_Dc;
  local_98._0_8_ = (double)uVar1 / 10.0;
  local_98._12_4_ = extraout_XMM0_Dd;
  QPen::~QPen((QPen *)&gradient);
  QBrush::~QBrush((QBrush *)&QStack_b8);
  local_a8 = (double)local_98._0_8_ + (double)local_98._0_8_;
  uStack_a0 = local_98._8_8_;
  QPainter::drawLine(painter,0,(int)((double)this->radius - params->margin),0,(int)-local_a8);
  QBrush::QBrush((QBrush *)&gradient,&this->backgroundColor,1);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&gradient);
  QPainter::setPen((PenStyle)painter);
  x = (int)-(double)local_98._0_8_;
  w = (int)local_a8;
  QPainter::drawEllipse(painter,x,x,w,w);
  QPainter::restore();
  QPainter::save();
  fVar2 = (float)QColor::redF();
  local_a8._0_4_ = fVar2;
  fVar2 = (float)QColor::greenF();
  local_a8._0_4_ = fVar2 + local_a8._0_4_;
  fVar2 = (float)QColor::blueF();
  local_a8 = (double)CONCAT44(local_a8._4_4_,fVar2 + local_a8._0_4_);
  QPainter::translate(painter,(double)this->radius,(double)this->radius);
  QRadialGradient::QRadialGradient
            (&gradient,0.0,0.0,(double)local_98._0_8_,(double)local_98._0_8_,(double)local_98._0_8_)
  ;
  if (1.0 <= local_a8._0_4_) {
    QGradient::setColorAt(1.0,(QColor *)&gradient);
    QColor::QColor(&QStack_b8,transparent);
    QGradient::setColorAt(0.0,(QColor *)&gradient);
  }
  else {
    QGradient::setColorAt(0.0,(QColor *)&gradient);
    QColor::QColor(&QStack_b8,transparent);
    QGradient::setColorAt(1.0,(QColor *)&gradient);
  }
  QBrush::QBrush((QBrush *)&QStack_b8,(QGradient *)&gradient);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&QStack_b8);
  QPainter::setPen((PenStyle)painter);
  QPainter::drawEllipse(painter,x,x,w,w);
  QPainter::restore();
  QRadialGradient::~QRadialGradient(&gradient);
  return;
}

Assistant:

void
MeterPrivate::drawNeedle( QPainter & painter, DrawParams & params )
{
	const qreal r = radius / 10.0;

	painter.save();
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle + params.scaleDegree * value / ( maxValue - minValue ) );
	painter.setPen( QPen( needleColor, radius / 75.0 ) );
	painter.drawLine( 0, radius - params.margin, 0, - ( r * 2.0 ) );
	painter.setBrush( backgroundColor );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();

	painter.save();
	const auto c = backgroundColor.redF() + backgroundColor.greenF() + backgroundColor.blueF();
	painter.translate( radius, radius );
	QRadialGradient gradient( 0.0, 0.0, r, r, r );

	if( c < 1.0 )
	{
		gradient.setColorAt( 0.0, textColor );
		gradient.setColorAt( 1.0, Qt::transparent );
	}
	else
	{
		gradient.setColorAt( 1.0, textColor );
		gradient.setColorAt( 0.0, Qt::transparent );
	}

	painter.setBrush( gradient );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();
}